

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::prep_in_buffer(jpeg_decoder *this)

{
  uint8 *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  this->m_in_buf_left = 0;
  this->m_pIn_buf_ofs = this->m_in_buf;
  if (this->m_eof_flag == false) {
    lVar3 = 0;
    do {
      iVar2 = (*this->m_pStream->_vptr_jpeg_decoder_stream[2])
                        (this->m_pStream,this->m_in_buf + (int)lVar3,(ulong)(0x2000 - (int)lVar3),
                         &this->m_eof_flag);
      if (iVar2 == -1) {
        stop_decoding(this,JPGD_STREAM_READ);
      }
      lVar3 = (long)iVar2 + (long)this->m_in_buf_left;
      iVar2 = (int)lVar3;
      this->m_in_buf_left = iVar2;
    } while ((iVar2 < 0x2000) && (this->m_eof_flag != true));
    this->m_total_bytes_read = this->m_total_bytes_read + iVar2;
    puVar1 = this->m_pIn_buf_ofs;
    for (lVar4 = 0; (int)lVar4 != 0x40; lVar4 = lVar4 + 1) {
      (puVar1 + lVar4 * 2 + lVar3)[0] = 0xff;
      (puVar1 + lVar4 * 2 + lVar3)[1] = 0xd9;
    }
  }
  return;
}

Assistant:

void jpeg_decoder::prep_in_buffer()
	{
		m_in_buf_left = 0;
		m_pIn_buf_ofs = m_in_buf;

		if (m_eof_flag)
			return;

		do
		{
			int bytes_read = m_pStream->read(m_in_buf + m_in_buf_left, JPGD_IN_BUF_SIZE - m_in_buf_left, &m_eof_flag);
			if (bytes_read == -1)
				stop_decoding(JPGD_STREAM_READ);

			m_in_buf_left += bytes_read;
		} while ((m_in_buf_left < JPGD_IN_BUF_SIZE) && (!m_eof_flag));

		m_total_bytes_read += m_in_buf_left;

		// Pad the end of the block with M_EOI (prevents the decompressor from going off the rails if the stream is invalid).
		// (This dates way back to when this decompressor was written in C/asm, and the all-asm Huffman decoder did some fancy things to increase perf.)
		word_clear(m_pIn_buf_ofs + m_in_buf_left, 0xD9FF, 64);
	}